

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

ostream * operator<<(ostream *s,Matrix *m)

{
  ostream *poVar1;
  ostream *poVar2;
  size_t in_RCX;
  uint uVar3;
  void *__buf;
  long lVar4;
  Matrix local_128;
  
  if (m->nMatrixDimension == 0) {
    poVar2 = std::ostream::_M_insert<double>(*m->pData);
  }
  else {
    poVar2 = s;
    if (m->nMatrixDimension == 1) {
      if (0 < *m->pSize) {
        lVar4 = 0;
        do {
          poVar1 = std::ostream::_M_insert<double>(m->pData[lVar4]);
          local_128.super_Physical._vptr_Physical._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_128,1);
          lVar4 = lVar4 + 1;
        } while (lVar4 < *m->pSize);
      }
    }
    else if (0 < *m->pSize) {
      __buf = (void *)0x0;
      do {
        Matrix::read(&local_128,(int)m,__buf,in_RCX);
        operator<<(s,&local_128);
        Matrix::~Matrix(&local_128);
        uVar3 = (int)__buf + 1;
        __buf = (void *)(ulong)uVar3;
      } while ((int)uVar3 < *m->pSize);
    }
  }
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return s;
}

Assistant:

ostream& operator<<(ostream& s, const Matrix& m)
{	
	switch( m.nMatrixDimension ) {
	case 0:
		s  << m.pData[0] << endl;
		break;
	case 1:
		for( int i=0; i<m.pSize[0]; i++ )
			s << m.pData[i] << ' ';
		s << endl;
		break;
	default:
		// start recursion
		for(int i=0; i<m.pSize[0]; i++) 
			s << m.read(i);
		s << endl;			
		break;
	}
	return s;
}